

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
CLI::Config::to_flag_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Config *this,ConfigItem *item)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  unsigned_long __n;
  ConversionError *__return_storage_ptr___00;
  string val;
  long *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  undefined8 uStack_78;
  string local_70 [2];
  
  pbVar1 = (item->inputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(item->inputs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x20) {
    __return_storage_ptr___00 = (ConversionError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(local_70,item);
    ConversionError::TooManyInputsFlag(__return_storage_ptr___00,local_70);
    __cxa_throw(__return_storage_ptr___00,&ConversionError::typeinfo,Error::~Error);
  }
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + pbVar1->_M_string_length);
  local_d0 = (long *)&local_c0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_d0,(undefined1 *)(local_c8 + (long)local_d0),local_d0);
  if (local_d0 == (long *)&local_c0) {
    uStack_78 = uStack_b8;
    local_90 = &local_80;
  }
  else {
    local_90 = local_d0;
  }
  local_80 = CONCAT71(uStack_bf,local_c0);
  local_88 = local_c8;
  local_c8 = 0;
  local_c0 = 0;
  local_d0 = (long *)&local_c0;
  ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_d0 != (long *)&local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  iVar3 = ::std::__cxx11::string::compare((char *)&local_b0);
  if (iVar3 != 0) {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_b0);
    if (iVar3 != 0) {
      iVar3 = ::std::__cxx11::string::compare((char *)&local_b0);
      if (iVar3 != 0) {
        iVar3 = ::std::__cxx11::string::compare((char *)&local_b0);
        if (iVar3 != 0) {
          iVar3 = ::std::__cxx11::string::compare((char *)&local_b0);
          if (iVar3 != 0) {
            iVar3 = ::std::__cxx11::string::compare((char *)&local_b0);
            if (iVar3 != 0) {
              __n = std::__cxx11::stoul(&local_b0,(size_t *)0x0,10);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(__return_storage_ptr__,__n,(allocator_type *)&local_90);
              goto LAB_00179ea5;
            }
          }
        }
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_00179ea5;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,1,(allocator_type *)&local_90);
LAB_00179ea5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::string> to_flag(const ConfigItem &item) const {
        if(item.inputs.size() == 1) {
            std::string val = item.inputs.at(0);
            val = detail::to_lower(val);

            if(val == "true" || val == "on" || val == "yes") {
                return std::vector<std::string>(1);
            } else if(val == "false" || val == "off" || val == "no") {
                return std::vector<std::string>();
            } else {
                try {
                    size_t ui = std::stoul(val);
                    return std::vector<std::string>(ui);
                } catch(const std::invalid_argument &) {
                    throw ConversionError::TrueFalse(item.fullname());
                }
            }
        } else {
            throw ConversionError::TooManyInputsFlag(item.fullname());
        }
    }